

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_xyz_grad(REF_DBL **xyzs,REF_DBL *scalar,REF_DBL *gradient)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  REF_STATUS RVar5;
  double in_RAX;
  double dVar6;
  REF_DBL RVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  REF_DBL vol;
  double local_28;
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  local_28 = in_RAX;
  ref_node_xyz_vol(xyzs,&local_28);
  local_28 = local_28 * -6.0;
  pdVar1 = xyzs[3];
  pdVar2 = xyzs[2];
  pdVar3 = *xyzs;
  pdVar4 = xyzs[1];
  dVar16 = *pdVar3;
  dVar8 = pdVar3[1];
  dVar13 = *pdVar1 - dVar16;
  dVar14 = pdVar1[1] - dVar8;
  dVar17 = pdVar3[2];
  dVar15 = pdVar1[2] - dVar17;
  dVar10 = *pdVar2 - dVar16;
  dVar12 = pdVar2[1] - dVar8;
  dVar6 = pdVar2[2] - dVar17;
  dVar16 = *pdVar4 - dVar16;
  dVar8 = pdVar4[1] - dVar8;
  dVar17 = pdVar4[2] - dVar17;
  dVar9 = *scalar;
  dVar11 = (scalar[3] - dVar9) * (dVar12 * dVar17 - dVar8 * dVar6) +
           (scalar[2] - dVar9) * (dVar8 * dVar15 - dVar14 * dVar17) +
           (scalar[1] - dVar9) * (dVar14 * dVar6 - dVar12 * dVar15);
  *gradient = dVar11;
  dVar9 = *scalar;
  dVar9 = (scalar[3] - dVar9) * (dVar6 * dVar16 - dVar17 * dVar10) +
          (scalar[2] - dVar9) * (dVar17 * dVar13 - dVar15 * dVar16) +
          (scalar[1] - dVar9) * (dVar15 * dVar10 - dVar6 * dVar13);
  gradient[1] = dVar9;
  dVar17 = *scalar;
  dVar8 = (scalar[3] - dVar17) * (dVar8 * dVar10 - dVar16 * dVar12) +
          (scalar[2] - dVar17) * (dVar16 * dVar14 - dVar13 * dVar8) +
          (scalar[1] - dVar17) * (dVar13 * dVar12 - dVar10 * dVar14);
  gradient[2] = dVar8;
  dVar16 = local_28 * 1e+20;
  if (dVar16 <= -dVar16) {
    dVar16 = -dVar16;
  }
  dVar17 = dVar11;
  if (dVar11 <= -dVar11) {
    dVar17 = -dVar11;
  }
  if (dVar17 < dVar16) {
    dVar17 = dVar9;
    if (dVar9 <= -dVar9) {
      dVar17 = -dVar9;
    }
    if (dVar17 < dVar16) {
      dVar17 = dVar8;
      if (dVar8 <= -dVar8) {
        dVar17 = -dVar8;
      }
      if (dVar17 < dVar16) {
        *gradient = dVar11 / local_28;
        gradient[1] = dVar9 / local_28;
        RVar7 = dVar8 / local_28;
        RVar5 = 0;
        goto LAB_0012c55d;
      }
    }
  }
  *gradient = 0.0;
  gradient[1] = 0.0;
  RVar5 = 4;
  RVar7 = 0.0;
LAB_0012c55d:
  gradient[2] = RVar7;
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_node_xyz_grad(REF_DBL *xyzs[4], REF_DBL *scalar,
                                     REF_DBL *gradient) {
  REF_DBL vol, norm1[3], norm2[3], norm3[3];
  REF_DBL *xyz0, *xyz1, *xyz2;

  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_xyz_vol(xyzs, &vol), "vol");
  vol *= -6.0;

  xyz0 = xyzs[0];
  xyz1 = xyzs[3];
  xyz2 = xyzs[2];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm1), "vol");

  xyz0 = xyzs[0];
  xyz1 = xyzs[1];
  xyz2 = xyzs[3];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm2), "vol");

  xyz0 = xyzs[0];
  xyz1 = xyzs[2];
  xyz2 = xyzs[1];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm3), "vol");

  gradient[0] = (scalar[1] - scalar[0]) * norm1[0] +
                (scalar[2] - scalar[0]) * norm2[0] +
                (scalar[3] - scalar[0]) * norm3[0];
  gradient[1] = (scalar[1] - scalar[0]) * norm1[1] +
                (scalar[2] - scalar[0]) * norm2[1] +
                (scalar[3] - scalar[0]) * norm3[1];
  gradient[2] = (scalar[1] - scalar[0]) * norm1[2] +
                (scalar[2] - scalar[0]) * norm2[2] +
                (scalar[3] - scalar[0]) * norm3[2];

  if (ref_math_divisible(gradient[0], vol) &&
      ref_math_divisible(gradient[1], vol) &&
      ref_math_divisible(gradient[2], vol)) {
    gradient[0] /= vol;
    gradient[1] /= vol;
    gradient[2] /= vol;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}